

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O0

wchar_t __thiscall Centaurus::Stream::skip_whitespace(Stream *this)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t ch;
  Stream *this_local;
  
  while( true ) {
    while( true ) {
      wVar1 = peek(this);
      iVar2 = iswspace(wVar1);
      if (iVar2 == 0) break;
      discard(this);
    }
    if (wVar1 != L'/') break;
    wVar1 = peek(this,2);
    if (wVar1 == L'*') {
      discard(this,2);
      skip_multiline_comment(this);
    }
    else {
      if (wVar1 != L'/') {
        return L'/';
      }
      discard(this,2);
      skip_oneline_comment(this);
    }
  }
  return wVar1;
}

Assistant:

wchar_t skip_whitespace()
    {
        wchar_t ch;

        while (true)
        {
            ch = peek();

            if (std::iswspace(ch))
            {
                discard();
            }
            else if (ch == L'/')
            {
                ch = peek(2);
                if (ch == L'*')
                {
                    discard(2);
                    skip_multiline_comment();
                }
                else if (ch == L'/')
                {
                    discard(2);
                    skip_oneline_comment();
                }
                else
                {
                    return L'/';
                }
            }
            else
            {
                break;
            }
        }
        return ch;
    }